

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void flatbuffers::tests::EnumValueTest(void)

{
  int iVar1;
  unsigned_long uVar2;
  
  iVar1 = TestValue<int>("{ y:0 }","E","enum E:int { V }");
  TestEq<int,int>(iVar1,0,"\'TestValue<int>(\"{ y:0 }\", \"E\", \"enum E:int { V }\")\' != \'0\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x23c,"");
  iVar1 = TestValue<int>("{ y:V }","E","enum E:int { V }");
  TestEq<int,int>(iVar1,0,"\'TestValue<int>(\"{ y:V }\", \"E\", \"enum E:int { V }\")\' != \'0\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x23d,"");
  iVar1 = TestValue<int>("{ }","E","enum E:int { V }");
  TestEq<int,int>(iVar1,0,"\'TestValue<int>(\"{ }\", \"E\", \"enum E:int { V }\")\' != \'0\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x23f,"");
  iVar1 = TestValue<int>("{ y:5 }","E=V","enum E:int { V=5 }");
  TestEq<int,int>(iVar1,5,
                  "\'TestValue<int>(\"{ y:5 }\", \"E=V\", \"enum E:int { V=5 }\")\' != \'5\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x240,"");
  iVar1 = TestValue<int>((char *)0x0,"E=V","enum E:int { V=5 }");
  TestEq<int,int>(iVar1,5,"\'TestValue<int>(nullptr, \"E=V\", \"enum E:int { V=5 }\")\' != \'5\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x242,"");
  iVar1 = TestValue<int>("{ y:5 }","E","enum E:int { Z, V=5 }");
  TestEq<int,int>(iVar1,5,
                  "\'TestValue<int>(\"{ y:5 }\", \"E\", \"enum E:int { Z, V=5 }\")\' != \'5\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x244,"");
  iVar1 = TestValue<int>("{ y:5 }","E=V","enum E:int { Z, V=5 }");
  TestEq<int,int>(iVar1,5,
                  "\'TestValue<int>(\"{ y:5 }\", \"E=V\", \"enum E:int { Z, V=5 }\")\' != \'5\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x245,"");
  iVar1 = TestValue<int>((char *)0x0,"E","enum E:int { Z, V=5 }");
  TestEq<int,int>(iVar1,0,"\'TestValue<int>(nullptr, \"E\", \"enum E:int { Z, V=5 }\")\' != \'0\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x247,"");
  iVar1 = TestValue<int>((char *)0x0,"E=V","enum E:int { Z, V=5 }");
  TestEq<int,int>(iVar1,5,"\'TestValue<int>(nullptr, \"E=V\", \"enum E:int { Z, V=5 }\")\' != \'5\'"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x248,"");
  uVar2 = TestValue<unsigned_long>((char *)0x0,"E=V","enum E:ulong { V = 13835058055282163712 }");
  TestEq<unsigned_long,unsigned_long_long>
            (uVar2,0xc000000000000000,
             "\'TestValue<uint64_t>(nullptr, \"E=V\", \"enum E:ulong { V = 13835058055282163712 }\")\' != \'13835058055282163712ULL\'"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0x24c,"");
  uVar2 = TestValue<unsigned_long>((char *)0x0,"E=V","enum E:ulong { V = 18446744073709551615 }");
  TestEq<unsigned_long,unsigned_long_long>
            (uVar2,0xffffffffffffffff,
             "\'TestValue<uint64_t>(nullptr, \"E=V\", \"enum E:ulong { V = 18446744073709551615 }\")\' != \'18446744073709551615ULL\'"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0x24f,"");
  iVar1 = TestValue<int>("{ y:7 }","E","enum E:int { V = 0 }");
  TestEq<int,int>(iVar1,7,
                  "\'TestValue<int>(\"{ y:7 }\", \"E\", \"enum E:int { V = 0 }\")\' != \'7\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x251,"");
  iVar1 = TestValue<int>("{ y:5 }","E=V","enum E:int { Z=10, V=5 }");
  TestEq<int,int>(iVar1,5,
                  "\'TestValue<int>(\"{ y:5 }\", \"E=V\", \"enum E:int { Z=10, V=5 }\")\' != \'5\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
                  ,0x253,"");
  return;
}

Assistant:

void EnumValueTest() {
  // json: "{ Y:0 }", schema: table X { y: "E"}
  // 0 in enum (V=0) E then Y=0 is valid.
  TEST_EQ(TestValue<int>("{ y:0 }", "E", "enum E:int { V }"), 0);
  TEST_EQ(TestValue<int>("{ y:V }", "E", "enum E:int { V }"), 0);
  // A default value of Y is 0.
  TEST_EQ(TestValue<int>("{ }", "E", "enum E:int { V }"), 0);
  TEST_EQ(TestValue<int>("{ y:5 }", "E=V", "enum E:int { V=5 }"), 5);
  // Generate json with defaults and check.
  TEST_EQ(TestValue<int>(nullptr, "E=V", "enum E:int { V=5 }"), 5);
  // 5 in enum
  TEST_EQ(TestValue<int>("{ y:5 }", "E", "enum E:int { Z, V=5 }"), 5);
  TEST_EQ(TestValue<int>("{ y:5 }", "E=V", "enum E:int { Z, V=5 }"), 5);
  // Generate json with defaults and check.
  TEST_EQ(TestValue<int>(nullptr, "E", "enum E:int { Z, V=5 }"), 0);
  TEST_EQ(TestValue<int>(nullptr, "E=V", "enum E:int { Z, V=5 }"), 5);
  // u84 test
  TEST_EQ(TestValue<uint64_t>(nullptr, "E=V",
                              "enum E:ulong { V = 13835058055282163712 }"),
          13835058055282163712ULL);
  TEST_EQ(TestValue<uint64_t>(nullptr, "E=V",
                              "enum E:ulong { V = 18446744073709551615 }"),
          18446744073709551615ULL);
  // Assign non-enum value to enum field. Is it right?
  TEST_EQ(TestValue<int>("{ y:7 }", "E", "enum E:int { V = 0 }"), 7);
  // Check that non-ascending values are valid.
  TEST_EQ(TestValue<int>("{ y:5 }", "E=V", "enum E:int { Z=10, V=5 }"), 5);
}